

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.c
# Opt level: O0

void * log_2(void *p)

{
  int iVar1;
  pthread_t *in_RDI;
  int line2;
  char *func2;
  char *file2;
  int line1;
  char *func1;
  char *file1;
  pthread_t *pt;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char **in_stack_ffffffffffffffd0;
  
  zt_log_set_debug_info
            ((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pthread_join(*in_RDI,(void **)0x0);
  zt_log_get_debug_info
            (in_stack_ffffffffffffffd0,
             (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (char **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_err,"test2");
  iVar1 = strcmp("/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
                 ,(char *)in_stack_ffffffffffffffd0);
  if (iVar1 == 0) {
    iVar1 = strcmp("log_2",(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if ((iVar1 == 0) && (in_stack_ffffffffffffffc4 == 0xa2)) {
      _count2 = _count2 + 1;
    }
  }
  return (void *)0x0;
}

Assistant:

void *
log_2(void * p) {
    pthread_t  * pt = p;
    const char * file1;
    const char * func1;
    int          line1;
    const char * file2;
    const char * func2;
    int          line2;

    ZT_LOG_DEBUG_INFO(), file1 = __FILE__, line1 = __LINE__, func1 = ZT_LOG_FUNCTION;
    pthread_join(*pt, NULL);
    zt_log_get_debug_info(&file2, &line2, &func2);
    zt_log_printf(zt_log_err, "test2");

    if ((strcmp(file1, file2) == 0) &&
        (strcmp(func1, func2) == 0) &&
        line1 == line2) {
        _count2++;
    }

    return NULL;
}